

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_signals.cpp
# Opt level: O2

int main(void)

{
  pointer ptVar1;
  slot_type *s;
  __sighandler_t in_RDX;
  __sighandler_t __handler;
  thread *thread;
  pointer ptVar2;
  int iVar3;
  int in_ESI;
  atomic<int> *value;
  bool bVar4;
  atomic<int> counter;
  long *local_d8;
  thread local_d0;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  signal<void_()> sig;
  
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  obs::signal<void_()>::signal(&sig,in_ESI,in_RDX);
  counter.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  iVar3 = 100;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    s = (slot_type *)operator_new(0x28);
    (s->super_slot_base)._vptr_slot_base = (_func_int **)&PTR__slot_00106d30;
    *(undefined8 *)((long)&(s->f).super__Function_base._M_functor + 8) = 0;
    *(atomic<int> **)&(s->f).super__Function_base._M_functor = &counter;
    (s->f)._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/count_signals.cpp:21:17)>
         ::_M_invoke;
    (s->f).super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/count_signals.cpp:21:17)>
         ::_M_manager;
    obs::signal<void_()>::add_slot(&sig,s);
  }
  iVar3 = 100;
  while (ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish, bVar4 = iVar3 != 0, iVar3 = iVar3 + -1,
        ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start, bVar4) {
    local_d0._M_id._M_thread = (id)0;
    local_d8 = (long *)operator_new(0x10);
    *local_d8 = (long)&PTR___State_00106d88;
    local_d8[1] = (long)&sig;
    std::thread::_M_start_thread(&local_d0,&local_d8,0);
    if (local_d8 != (long *)0x0) {
      (**(code **)(*local_d8 + 8))();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&threads,&local_d0);
    std::thread::~thread(&local_d0);
  }
  for (; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  local_d8 = (long *)CONCAT44(local_d8._4_4_,1000000);
  value = &counter;
  expect_eq<int,std::atomic<int>>
            ((int *)&local_d8,value,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/count_signals.cpp"
             ,0x24);
  obs::signal<void_()>::~signal(&sig,(int)value,__handler);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  return 0;
}

Assistant:

int main() {
  std::vector<std::thread> threads;
  obs::signal<void()> sig;

  // We need and atomic operator++()
  std::atomic<int> counter(0);

  for (int i=0; i<100; ++i) {
    sig.connect([&](){ ++counter; });
  }

  for (int i=0; i<100; ++i) {
    threads.push_back(
      std::thread(
        [&](){
          for (int i=0; i<100; ++i)
            sig();
        }));
  }

  for (auto& thread : threads)
    thread.join();

  EXPECT_EQ(100*100*100, counter);
}